

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginalTrek++.cpp
# Opt level: O0

void __thiscall IsoSpec::Marginal::Marginal(Marginal *this,Marginal *other)

{
  Marginal *other_local;
  Marginal *this_local;
  
  this->_vptr_Marginal = (_func_int **)&PTR__Marginal_00154ad0;
  this->disowned = (bool)(other->disowned & 1);
  this->isotopeNo = other->isotopeNo;
  this->atomCnt = other->atomCnt;
  this->atom_lProbs = other->atom_lProbs;
  this->atom_masses = other->atom_masses;
  this->loggamma_nominator = other->loggamma_nominator;
  other->disowned = true;
  if (other->mode_conf == (Conf)0x0) {
    this->mode_conf = (Conf)0x0;
  }
  else {
    this->mode_conf = other->mode_conf;
    this->mode_lprob = other->mode_lprob;
  }
  return;
}

Assistant:

Marginal::Marginal(Marginal&& other) :
disowned(other.disowned),
isotopeNo(other.isotopeNo),
atomCnt(other.atomCnt),
atom_lProbs(other.atom_lProbs),
atom_masses(other.atom_masses),
loggamma_nominator(other.loggamma_nominator)
{
    other.disowned = true;
    if(other.mode_conf == nullptr)
    {
        mode_conf = nullptr;
        // Deliberately not initializing mode_lprob. In this state other.mode_lprob is uninitialized too.
    }
    else
    {
        mode_conf = other.mode_conf;
        mode_lprob = other.mode_lprob;
    }
}